

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhash.cc
# Opt level: O3

int __thiscall
bdHashSet::search(bdHashSet *this,string *key,uint32_t maxAge,
                 list<bdHashEntry,_std::allocator<bdHashEntry>_> *entries)

{
  _Rb_tree_header *__y;
  iterator iVar1;
  iterator iVar2;
  time_t tVar3;
  _Node *p_Var4;
  _Self __tmp;
  
  __y = &(this->mEntries)._M_t._M_impl.super__Rb_tree_header;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
          ::_M_lower_bound(&(this->mEntries)._M_t,
                           (_Link_type)
                           (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                           &__y->_M_header,key);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bdHashEntry>_>_>
          ::_M_upper_bound(&(this->mEntries)._M_t,
                           (_Link_type)
                           (this->mEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                           &__y->_M_header,key);
  tVar3 = time((time_t *)0x0);
  if (iVar1._M_node != iVar2._M_node) {
    do {
      if (tVar3 - *(long *)(iVar1._M_node + 3) < (long)(int)maxAge) {
        p_Var4 = std::__cxx11::list<bdHashEntry,std::allocator<bdHashEntry>>::
                 _M_create_node<bdHashEntry_const&>
                           ((list<bdHashEntry,std::allocator<bdHashEntry>> *)entries,
                            (bdHashEntry *)(iVar1._M_node + 2));
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        *(long *)(entries + 0x10) = *(long *)(entries + 0x10) + 1;
      }
      iVar1._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar1._M_node);
    } while (iVar1._M_node != iVar2._M_node);
  }
  return (int)(*(long *)(entries + 0x10) != 0);
}

Assistant:

int 	bdHashSet::search(std::string key, uint32_t maxAge, std::list<bdHashEntry> &entries) {
	std::multimap<std::string, bdHashEntry>::iterator sit, eit, it;
        sit = mEntries.lower_bound(key);
        eit = mEntries.upper_bound(key);

	time_t now = time(NULL);

	for (it = sit; it != eit; it++) {
		time_t age = now - it->second.mStoreTS;
		if (age < (int32_t) maxAge) {
			entries.push_back(it->second);
		}
	}
	return (0 < entries.size());
}